

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_https.hpp
# Opt level: O1

void __thiscall
SimpleWeb::
Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
handshake(Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
          *this,shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session>
                *session)

{
  anon_class_24_2_447ba543_for_handler_ local_30;
  _Head_base<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_*,_false>
  local_18;
  
  SSL_ctrl(*(SSL **)((long)(((((session->
                               super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->connection).
                             super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->socket)._M_t.
                           super___uniq_ptr_impl<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
                    + 0x50),0x37,0,
           (this->
           super_ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
           ).host._M_dataplus._M_p);
  ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
  Connection::set_timeout
            ((((session->
               super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->connection).
             super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,(this->
                     super_ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
                     ).config.timeout_connect);
  local_30.session.
  super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (session->
            super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  local_18._M_head_impl =
       *(stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> **)
        &((((local_30.session.
             super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->connection).
           super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->socket)._M_t.
         super___uniq_ptr_impl<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_*,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
  ;
  local_30.session.
  super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (session->
       super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  if (local_30.session.
      super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.session.
       super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_30.session.
            super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.session.
       super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_30.session.
            super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_30.this = this;
  asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>::
  initiate_async_handshake::operator()(&local_18,&local_30,client);
  if (local_30.session.
      super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.session.
               super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void handshake(const std::shared_ptr<Session> &session) {
      SSL_set_tlsext_host_name(session->connection->socket->native_handle(), this->host.c_str());

      session->connection->set_timeout(this->config.timeout_connect);
      session->connection->socket->async_handshake(asio::ssl::stream_base::client, [this, session](const error_code &ec) {
        session->connection->cancel_timeout();
        auto lock = session->connection->handler_runner->continue_lock();
        if(!lock)
          return;
        if(!ec)
          this->write(session);
        else
          session->callback(ec);
      });
    }